

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void PrintMap<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *d)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *e;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *d_local;
  
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::begin(d);
  e = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(d);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&e);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator*(&__end0);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)ppVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar2->second);
    std::operator<<(poVar3,",");
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&__end0);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintMap(T &d)
{
    for(auto &&e : d)
    {
        cout << e.first << " " << e.second << ",";
    }

    cout << endl;
}